

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.cc
# Opt level: O0

uint32_t __thiscall re2c::Enc::decodeUnsafe(Enc *this,uint32_t c)

{
  uint32_t local_14;
  uint32_t c_local;
  Enc *this_local;
  
  local_14 = c;
  if ((this->type_ != ASCII) && (this->type_ == EBCDIC)) {
    local_14 = *(uint32_t *)(ebc2asc + (ulong)(c & 0xff) * 4);
  }
  return local_14;
}

Assistant:

uint32_t Enc::decodeUnsafe(uint32_t c) const
{
	switch (type_)
	{
		case EBCDIC:
			c = ebc2asc[c & 0xFF];
			break;
		case ASCII:
		case UCS2:
		case UTF16:
		case UTF32:
		case UTF8:
			break;
	}
	return c;
}